

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O3

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateI32Helper
          (BuiltInsValidator *this,Decoration *decoration,Instruction *inst,
          function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *diag,uint32_t underlying_type)

{
  bool bVar1;
  uint32_t uVar2;
  ostream *poVar3;
  long *plVar4;
  Instruction *inst_00;
  size_type *psVar5;
  spv_result_t sVar6;
  ostringstream ss;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  
  inst_00 = (Instruction *)diag;
  bVar1 = ValidationState_t::IsIntScalarType(this->_,underlying_type);
  if (bVar1) {
    uVar2 = ValidationState_t::GetBitWidth(this->_,underlying_type);
    sVar6 = SPV_SUCCESS;
    if (uVar2 != 0x20) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                (&local_1c8,decoration,(Decoration *)inst,inst_00);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,local_1c8._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," has bit width ",0xf);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,".",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringbuf::str();
      if ((diag->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_001acd97;
      sVar6 = (*diag->_M_invoker)((_Any_data *)diag,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
  }
  else {
    (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
              (&local_1c8,decoration,(Decoration *)inst,inst_00);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_1c8);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_1a8[0].field_2._0_8_ = *psVar5;
      local_1a8[0].field_2._8_4_ = (undefined4)plVar4[3];
      local_1a8[0].field_2._12_4_ = *(undefined4 *)((long)plVar4 + 0x1c);
      local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    }
    else {
      local_1a8[0].field_2._0_8_ = *psVar5;
      local_1a8[0]._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_1a8[0]._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((diag->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_001acd97:
      std::__throw_bad_function_call();
    }
    sVar6 = (*diag->_M_invoker)((_Any_data *)diag,local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
  }
  return sVar6;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateI32Helper(
    const Decoration& decoration, const Instruction& inst,
    const std::function<spv_result_t(const std::string& message)>& diag,
    uint32_t underlying_type) {
  if (!_.IsIntScalarType(underlying_type)) {
    return diag(GetDefinitionDesc(decoration, inst) + " is not an int scalar.");
  }

  const uint32_t bit_width = _.GetBitWidth(underlying_type);
  if (bit_width != 32) {
    std::ostringstream ss;
    ss << GetDefinitionDesc(decoration, inst) << " has bit width " << bit_width
       << ".";
    return diag(ss.str());
  }

  return SPV_SUCCESS;
}